

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# shell_renderer.cpp
# Opt level: O1

void __thiscall
duckdb_shell::ModeAsciiRenderer::RenderRow(ModeAsciiRenderer *this,RowResult *result)

{
  ulong uVar1;
  
  if ((result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>._M_impl.
      super__Vector_impl_data._M_start) {
    uVar1 = 0;
    do {
      if (uVar1 != 0) {
        ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,
                          &(this->super_RowRenderer).super_ShellRenderer.col_sep);
      }
      ShellState::PrintValue
                ((this->super_RowRenderer).super_ShellRenderer.state,
                 (result->data).super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                 _M_impl.super__Vector_impl_data._M_start[uVar1]);
      uVar1 = uVar1 + 1;
    } while (uVar1 < (ulong)((long)(result->data).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_finish -
                             (long)(result->data).
                                   super__Vector_base<const_char_*,_std::allocator<const_char_*>_>.
                                   _M_impl.super__Vector_impl_data._M_start >> 3));
  }
  ShellState::Print((this->super_RowRenderer).super_ShellRenderer.state,
                    &(this->super_RowRenderer).super_ShellRenderer.row_sep);
  return;
}

Assistant:

void RenderRow(RowResult &result) override {
		auto &data = result.data;
		for (idx_t i = 0; i < data.size(); i++) {
			if (i > 0) {
				state.Print(col_sep);
			}
			state.PrintValue(data[i]);
		}
		state.Print(row_sep);
	}